

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_impl.h
# Opt level: O0

int secp256k1_ecdsa_sig_parse(secp256k1_scalar *rr,secp256k1_scalar *rs,uchar *sig,size_t size)

{
  uchar **ppuVar1;
  uchar *in_RCX;
  uchar **sigp;
  uchar **in_RDX;
  size_t *in_RSI;
  size_t rlen;
  uchar *sigend;
  undefined8 local_38;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  ppuVar1 = (uchar **)((long)in_RDX + (long)in_RCX);
  if ((in_RDX == ppuVar1) || (sigp = (uchar **)((long)in_RDX + 1), *(uchar *)in_RDX != '0')) {
    iVar2 = 0;
  }
  else {
    iVar2 = secp256k1_der_read_len(in_RSI,sigp,in_RCX);
    if (iVar2 == 0) {
      iVar2 = 0;
    }
    else if (local_38 == (long)ppuVar1 - (long)sigp) {
      iVar2 = secp256k1_der_parse_integer
                        ((secp256k1_scalar *)sigend,(uchar **)rlen,
                         (uchar *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      if (iVar2 == 0) {
        iVar2 = 0;
      }
      else {
        iVar2 = secp256k1_der_parse_integer
                          ((secp256k1_scalar *)sigend,(uchar **)rlen,
                           (uchar *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
        if (iVar2 == 0) {
          iVar2 = 0;
        }
        else if (sigp == ppuVar1) {
          iVar2 = 1;
        }
        else {
          iVar2 = 0;
        }
      }
    }
    else {
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int secp256k1_ecdsa_sig_parse(secp256k1_scalar *rr, secp256k1_scalar *rs, const unsigned char *sig, size_t size) {
    const unsigned char *sigend = sig + size;
    size_t rlen;
    if (sig == sigend || *(sig++) != 0x30) {
        /* The encoding doesn't start with a constructed sequence (X.690-0207 8.9.1). */
        return 0;
    }
    if (secp256k1_der_read_len(&rlen, &sig, sigend) == 0) {
        return 0;
    }
    if (rlen != (size_t)(sigend - sig)) {
        /* Tuple exceeds bounds or garage after tuple. */
        return 0;
    }

    if (!secp256k1_der_parse_integer(rr, &sig, sigend)) {
        return 0;
    }
    if (!secp256k1_der_parse_integer(rs, &sig, sigend)) {
        return 0;
    }

    if (sig != sigend) {
        /* Trailing garbage inside tuple. */
        return 0;
    }

    return 1;
}